

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O0

bool stackjit::fromString(string *str,AccessModifier *accessModifier)

{
  bool bVar1;
  AccessModifier *accessModifier_local;
  string *str_local;
  
  bVar1 = std::operator==(str,"public");
  if (bVar1) {
    *accessModifier = Public;
    str_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(str,"private");
    if (bVar1) {
      *accessModifier = Private;
      str_local._7_1_ = true;
    }
    else {
      str_local._7_1_ = false;
    }
  }
  return str_local._7_1_;
}

Assistant:

bool fromString(std::string str, AccessModifier& accessModifier) {
		if (str == "public") {
			accessModifier = AccessModifier::Public;
			return true;
		} else if (str == "private") {
			accessModifier = AccessModifier::Private;
			return true;
		}

		return false;
	}